

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

bool __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::
ImplicitProducer::
enqueue<(moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,loop::MessageLoop::TaskInfo*>
          (ImplicitProducer *this,TaskInfo **element)

{
  ulong uVar1;
  bool bVar2;
  long *plVar3;
  Block *pBVar4;
  ulong uVar5;
  ulong *puVar6;
  
  uVar1 = *(ulong *)(this + 0x20);
  if ((uVar1 & 0x1f) == 0) {
    if (0x8000000000000000 < uVar1 - *(long *)(this + 0x28)) {
      __assert_fail("!details::circular_less_than<index_t>(currentTailIndex, head)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                    ,0x964,
                    "bool moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ImplicitProducer::enqueue(U &&) [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits, allocMode = moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::CanAlloc, U = loop::MessageLoop::TaskInfo *]"
                   );
    }
    if ((*(long *)(this + 0x28) - uVar1) + 0x7fffffffffffffdf < 0x7fffffffffffffff) {
      plVar3 = *(long **)(this + 0x60);
      uVar5 = *plVar3 - 1U & plVar3[1] + 1U;
      puVar6 = *(ulong **)(plVar3[3] + uVar5 * 8);
      if ((*puVar6 != 1) && (puVar6[1] != 0)) {
        bVar2 = ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
                ::ImplicitProducer::new_block_index((ImplicitProducer *)this);
        if (!bVar2) goto LAB_0014ca92;
        plVar3 = *(long **)(this + 0x60);
        uVar5 = *plVar3 - 1U & plVar3[1] + 1U;
        puVar6 = *(ulong **)(plVar3[3] + uVar5 * 8);
        if (*puVar6 != 1) {
          __assert_fail("idxEntry->key.load(std::memory_order_relaxed) == INVALID_BLOCK_BASE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                        ,0xb09,
                        "bool moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ImplicitProducer::insert_block_index_entry(BlockIndexEntry *&, index_t) [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits, allocMode = moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::CanAlloc]"
                       );
        }
      }
      *puVar6 = uVar1;
      plVar3[1] = uVar5;
      pBVar4 = requisition_block<(moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                         (*(ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>
                            **)(this + 0x50));
      if (pBVar4 != (Block *)0x0) {
        (pBVar4->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
        puVar6[1] = (ulong)pBVar4;
        *(Block **)(this + 0x40) = pBVar4;
        goto LAB_0014c99a;
      }
      plVar3 = *(long **)(this + 0x60);
      plVar3[1] = *plVar3 - 1U & plVar3[1] - 1U;
      puVar6[1] = 0;
    }
LAB_0014ca92:
    bVar2 = false;
  }
  else {
    pBVar4 = *(Block **)(this + 0x40);
LAB_0014c99a:
    *(TaskInfo **)((long)&pBVar4->field_0 + (uVar1 & 0x1f) * 8) = *element;
    *(ulong *)(this + 0x20) = uVar1 + 1;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

inline bool enqueue(U&& element)
		{
			index_t currentTailIndex = this->tailIndex.load(std::memory_order_relaxed);
			index_t newTailIndex = 1 + currentTailIndex;
			if ((currentTailIndex & static_cast<index_t>(BLOCK_SIZE - 1)) == 0) {
				// We reached the end of a block, start a new one
				auto head = this->headIndex.load(std::memory_order_relaxed);
				assert(!details::circular_less_than<index_t>(currentTailIndex, head));
				if (!details::circular_less_than<index_t>(head, currentTailIndex + BLOCK_SIZE) || (MAX_SUBQUEUE_SIZE != details::const_numeric_max<size_t>::value && (MAX_SUBQUEUE_SIZE == 0 || MAX_SUBQUEUE_SIZE - BLOCK_SIZE < currentTailIndex - head))) {
					return false;
				}
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
				debug::DebugLock lock(mutex);
#endif
				// Find out where we'll be inserting this block in the block index
				BlockIndexEntry* idxEntry;
				if (!insert_block_index_entry<allocMode>(idxEntry, currentTailIndex)) {
					return false;
				}
				
				// Get ahold of a new block
				auto newBlock = this->parent->ConcurrentQueue::template requisition_block<allocMode>();
				if (newBlock == nullptr) {
					rewind_block_index_tail();
					idxEntry->value.store(nullptr, std::memory_order_relaxed);
					return false;
				}
#if MCDBGQ_TRACKMEM
				newBlock->owner = this;
#endif
				newBlock->ConcurrentQueue::Block::template reset_empty<implicit_context>();
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new (nullptr) T(std::forward<U>(element)))) {
					// May throw, try to insert now before we publish the fact that we have this new block
					MOODYCAMEL_TRY {
						new ((*newBlock)[currentTailIndex]) T(std::forward<U>(element));
					}
					MOODYCAMEL_CATCH (...) {
						rewind_block_index_tail();
						idxEntry->value.store(nullptr, std::memory_order_relaxed);
						this->parent->add_block_to_free_list(newBlock);
						MOODYCAMEL_RETHROW;
					}
				}
				
				// Insert the new block into the index
				idxEntry->value.store(newBlock, std::memory_order_relaxed);
				
				this->tailBlock = newBlock;
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new (nullptr) T(std::forward<U>(element)))) {
					this->tailIndex.store(newTailIndex, std::memory_order_release);
					return true;
				}
			}